

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  size_type *psVar2;
  pointer ppBVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  pointer *pppBVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  long *plVar12;
  undefined8 *puVar13;
  ulong *puVar14;
  ulong uVar15;
  int i;
  long lVar16;
  ulong uVar17;
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  counter;
  CircuitOramOpt oram;
  allocator local_15fc;
  allocator local_15fb;
  allocator local_15fa;
  allocator local_15f9;
  char **local_15f8;
  int local_15ec;
  ulong *local_15e8;
  long local_15e0;
  ulong local_15d8;
  long lStack_15d0;
  undefined8 *local_15c8;
  undefined8 local_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 *local_15a8;
  undefined8 local_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  string local_1588;
  ulong *local_1568;
  long local_1560;
  ulong local_1558;
  long lStack_1550;
  ulong *local_1548;
  long local_1540;
  ulong local_1538;
  long lStack_1530;
  undefined8 *local_1528;
  undefined8 local_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  ulong *local_1508;
  long local_1500;
  ulong local_14f8;
  long lStack_14f0;
  ulong *local_14e8;
  long local_14e0;
  ulong local_14d8 [2];
  ulong *local_14c8;
  long local_14c0;
  ulong local_14b8 [2];
  ulong *local_14a8;
  long local_14a0;
  ulong local_1498 [2];
  ulong *local_1488;
  long local_1480;
  ulong local_1478 [2];
  undefined1 *local_1468 [2];
  undefined1 local_1458 [16];
  map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  local_1448;
  CircuitOramOpt local_1418;
  
  std::__cxx11::string::string((string *)&local_1418,argv[1],(allocator *)&local_15e8);
  ppBVar3 = local_1418.super_CircuitOram.super_TreeOram.tree.
            super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar6 = __errno_location();
  iVar5 = *piVar6;
  *piVar6 = 0;
  pppBVar7 = (pointer *)strtol((char *)ppBVar3,(char **)&local_1448,10);
  if ((pointer)local_1448._M_t._M_impl._0_8_ == ppBVar3) {
    pppBVar7 = (pointer *)std::__throw_invalid_argument("stoi");
  }
  iVar4 = *piVar6;
  if ((pointer *)(long)(int)pppBVar7 != pppBVar7 || iVar4 == 0x22) {
    iVar4 = std::__throw_out_of_range("stoi");
  }
  if (iVar4 == 0) {
    *piVar6 = iVar5;
  }
  if (local_1418.super_CircuitOram.super_TreeOram.tree.
      super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1418.super_CircuitOram.super_TreeOram.tree.
                       super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl +
               0x10U)) {
    operator_delete(local_1418.super_CircuitOram.super_TreeOram.tree.
                    super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string((string *)&local_1418,argv[2],(allocator *)&local_15e8);
  ppBVar3 = local_1418.super_CircuitOram.super_TreeOram.tree.
            super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar5 = *piVar6;
  *piVar6 = 0;
  local_15f8 = argv;
  lVar8 = strtol((char *)local_1418.super_CircuitOram.super_TreeOram.tree.
                         super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                         super__Vector_impl_data._M_start,(char **)&local_1448,10);
  if ((pointer)local_1448._M_t._M_impl._0_8_ == ppBVar3) {
    lVar8 = std::__throw_invalid_argument("stoi");
  }
  iVar4 = *piVar6;
  if (lVar8 - 0x80000000U < 0xffffffff00000000 || iVar4 == 0x22) {
    iVar4 = std::__throw_out_of_range("stoi");
  }
  if (iVar4 == 0) {
    *piVar6 = iVar5;
  }
  if (local_1418.super_CircuitOram.super_TreeOram.tree.
      super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_1418.super_CircuitOram.super_TreeOram.tree.
                       super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl +
               0x10U)) {
    operator_delete(local_1418.super_CircuitOram.super_TreeOram.tree.
                    super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string((string *)&local_1418,local_15f8[3],(allocator *)&local_15e8);
  ppBVar3 = local_1418.super_CircuitOram.super_TreeOram.tree.
            super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_15ec = *piVar6;
  *piVar6 = 0;
  lVar9 = strtol((char *)local_1418.super_CircuitOram.super_TreeOram.tree.
                         super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                         super__Vector_impl_data._M_start,(char **)&local_1448,10);
  if ((pointer)local_1448._M_t._M_impl._0_8_ == ppBVar3) {
    pppBVar7 = (pointer *)
               ((long)&local_1418.super_CircuitOram.super_TreeOram.tree.
                       super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl +
               0x10);
    lVar9 = std::__throw_invalid_argument("stoi");
  }
  iVar5 = (int)pppBVar7;
  iVar4 = *piVar6;
  if (lVar9 - 0x80000000U < 0xffffffff00000000 || iVar4 == 0x22) {
    iVar5 = (int)&local_1418 + 0x10;
    lVar9 = std::__throw_out_of_range("stoi");
  }
  pppBVar7 = (pointer *)
             ((long)&local_1418.super_CircuitOram.super_TreeOram.tree.
                     super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl +
             0x10);
  if (iVar4 == 0) {
    *piVar6 = local_15ec;
  }
  if (local_1418.super_CircuitOram.super_TreeOram.tree.
      super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppBVar7) {
    operator_delete(local_1418.super_CircuitOram.super_TreeOram.tree.
                    super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string((string *)&local_1418,local_15f8[4],(allocator *)&local_1448);
  iVar4 = std::__cxx11::stoi((string *)&local_1418,(size_t *)0x0,10);
  if (local_1418.super_CircuitOram.super_TreeOram.tree.
      super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppBVar7) {
    operator_delete(local_1418.super_CircuitOram.super_TreeOram.tree.
                    super__Vector_base<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  TreeOram::TreeOram((TreeOram *)&local_1418,iVar5,(int)lVar8,iVar5);
  local_1418.cnt = 0;
  local_1418.cnt2 = 0;
  local_1418.naccess = (int)lVar9;
  local_1448._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1448._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1448._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1448._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1448._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1448._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1448._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1418.nevict = iVar4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Starting warmming up with ",0x1a);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x100000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," operations.",0xc);
  std::endl<char,std::char_traits<char>>(poVar10);
  lVar9 = (long)(1 << ((byte)iVar5 & 0x1f));
  lVar8 = 0x100000;
  if (0x100000 < lVar9) {
    lVar8 = lVar9;
  }
  lVar16 = 0;
  do {
    CircuitOramOpt::access(&local_1418,(char *)(lVar16 % lVar9 & 0xffffffff),(int)(lVar16 % lVar9));
    lVar16 = lVar16 + 1;
  } while (lVar8 != lVar16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warmup completed.",0x11)
  ;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  uVar17 = 1;
  lVar8 = 0;
  do {
    iVar5 = CircuitOramOpt::access
                      (&local_1418,(char *)(lVar8 % lVar9 & 0xffffffff),(int)(lVar8 % lVar9));
    if ((char)iVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"tree oram invariance is broken",0x1e);
      poVar10 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    if ((ulong *)(long)(local_1418.super_CircuitOram.super_TreeOram.stash)->bsize == (ulong *)0x32)
    {
      exit(1);
    }
    local_15e8 = (ulong *)(long)(local_1418.super_CircuitOram.super_TreeOram.stash)->bsize;
    pmVar11 = std::
              map<long_long,_long_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
              ::operator[](&local_1448,(key_type *)&local_15e8);
    *pmVar11 = *pmVar11 + 1;
    if ((uVar17 / 1000000) * 1000000 + -1 == lVar8) {
      local_1468[0] = local_1458;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1468,"circuit_opt","");
      plVar12 = (long *)std::__cxx11::string::append((char *)local_1468);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar14) {
        local_14f8 = *puVar14;
        lStack_14f0 = plVar12[3];
        local_1508 = &local_14f8;
      }
      else {
        local_14f8 = *puVar14;
        local_1508 = (ulong *)*plVar12;
      }
      local_1500 = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string((string *)&local_1488,local_15f8[1],&local_15f9);
      uVar15 = 0xf;
      if (local_1508 != &local_14f8) {
        uVar15 = local_14f8;
      }
      if (uVar15 < (ulong)(local_1480 + local_1500)) {
        uVar15 = 0xf;
        if (local_1488 != local_1478) {
          uVar15 = local_1478[0];
        }
        if (uVar15 < (ulong)(local_1480 + local_1500)) goto LAB_00103dd7;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_1488,0,(char *)0x0,(ulong)local_1508);
      }
      else {
LAB_00103dd7:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_1508,(ulong)local_1488);
      }
      puVar1 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar1) {
        local_1518 = *puVar1;
        uStack_1510 = puVar13[3];
        local_1528 = &local_1518;
      }
      else {
        local_1518 = *puVar1;
        local_1528 = (undefined8 *)*puVar13;
      }
      local_1520 = puVar13[1];
      *puVar13 = puVar1;
      puVar13[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_1528);
      local_1568 = &local_1558;
      puVar14 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar14) {
        local_1558 = *puVar14;
        lStack_1550 = plVar12[3];
      }
      else {
        local_1558 = *puVar14;
        local_1568 = (ulong *)*plVar12;
      }
      local_1560 = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string((string *)&local_14a8,local_15f8[2],&local_15fa);
      uVar15 = 0xf;
      if (local_1568 != &local_1558) {
        uVar15 = local_1558;
      }
      if (uVar15 < (ulong)(local_14a0 + local_1560)) {
        uVar15 = 0xf;
        if (local_14a8 != local_1498) {
          uVar15 = local_1498[0];
        }
        if (uVar15 < (ulong)(local_14a0 + local_1560)) goto LAB_00103f29;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_14a8,0,(char *)0x0,(ulong)local_1568);
      }
      else {
LAB_00103f29:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_1568,(ulong)local_14a8);
      }
      local_15c8 = &local_15b8;
      puVar1 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar1) {
        local_15b8 = *puVar1;
        uStack_15b0 = puVar13[3];
      }
      else {
        local_15b8 = *puVar1;
        local_15c8 = (undefined8 *)*puVar13;
      }
      local_15c0 = puVar13[1];
      *puVar13 = puVar1;
      puVar13[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_15c8);
      local_1548 = &local_1538;
      puVar14 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar14) {
        local_1538 = *puVar14;
        lStack_1530 = plVar12[3];
      }
      else {
        local_1538 = *puVar14;
        local_1548 = (ulong *)*plVar12;
      }
      local_1540 = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string((string *)&local_14c8,local_15f8[3],&local_15fb);
      uVar15 = 0xf;
      if (local_1548 != &local_1538) {
        uVar15 = local_1538;
      }
      if (uVar15 < (ulong)(local_14c0 + local_1540)) {
        uVar15 = 0xf;
        if (local_14c8 != local_14b8) {
          uVar15 = local_14b8[0];
        }
        if (uVar15 < (ulong)(local_14c0 + local_1540)) goto LAB_00104070;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_14c8,0,(char *)0x0,(ulong)local_1548);
      }
      else {
LAB_00104070:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_1548,(ulong)local_14c8);
      }
      local_15a8 = &local_1598;
      puVar1 = puVar13 + 2;
      if ((undefined8 *)*puVar13 == puVar1) {
        local_1598 = *puVar1;
        uStack_1590 = puVar13[3];
      }
      else {
        local_1598 = *puVar1;
        local_15a8 = (undefined8 *)*puVar13;
      }
      local_15a0 = puVar13[1];
      *puVar13 = puVar1;
      puVar13[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_15a8);
      local_15e8 = &local_15d8;
      puVar14 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar14) {
        local_15d8 = *puVar14;
        lStack_15d0 = plVar12[3];
      }
      else {
        local_15d8 = *puVar14;
        local_15e8 = (ulong *)*plVar12;
      }
      local_15e0 = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string((string *)&local_14e8,local_15f8[4],&local_15fc);
      uVar15 = 0xf;
      if (local_15e8 != &local_15d8) {
        uVar15 = local_15d8;
      }
      if (uVar15 < (ulong)(local_14e0 + local_15e0)) {
        uVar15 = 0xf;
        if (local_14e8 != local_14d8) {
          uVar15 = local_14d8[0];
        }
        if (uVar15 < (ulong)(local_14e0 + local_15e0)) goto LAB_0010419c;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_14e8,0,(char *)0x0,(ulong)local_15e8);
      }
      else {
LAB_0010419c:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_15e8,(ulong)local_14e8);
      }
      local_1588._M_dataplus._M_p = (pointer)&local_1588.field_2;
      psVar2 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_1588.field_2._M_allocated_capacity = *psVar2;
        local_1588.field_2._8_8_ = puVar13[3];
      }
      else {
        local_1588.field_2._M_allocated_capacity = *psVar2;
        local_1588._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_1588._M_string_length = puVar13[1];
      *puVar13 = psVar2;
      puVar13[1] = 0;
      *(undefined1 *)psVar2 = 0;
      pruint64_t(lVar8 + 1,&local_1448,&local_1588);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1588._M_dataplus._M_p != &local_1588.field_2) {
        operator_delete(local_1588._M_dataplus._M_p);
      }
      if (local_14e8 != local_14d8) {
        operator_delete(local_14e8);
      }
      if (local_15e8 != &local_15d8) {
        operator_delete(local_15e8);
      }
      if (local_15a8 != &local_1598) {
        operator_delete(local_15a8);
      }
      if (local_14c8 != local_14b8) {
        operator_delete(local_14c8);
      }
      if (local_1548 != &local_1538) {
        operator_delete(local_1548);
      }
      if (local_15c8 != &local_15b8) {
        operator_delete(local_15c8);
      }
      if (local_14a8 != local_1498) {
        operator_delete(local_14a8);
      }
      if (local_1568 != &local_1558) {
        operator_delete(local_1568);
      }
      if (local_1528 != &local_1518) {
        operator_delete(local_1528);
      }
      if (local_1488 != local_1478) {
        operator_delete(local_1488);
      }
      if (local_1508 != &local_14f8) {
        operator_delete(local_1508);
      }
      if (local_1468[0] != local_1458) {
        operator_delete(local_1468[0]);
      }
    }
    uVar17 = uVar17 + 1;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

int main(int argc, char ** argv )
{
   int logN = stoi(string(argv[1]));
   int cap = stoi(string(argv[2]));
   int access = stoi(string(argv[3]));
   int evict = stoi(string(argv[4]));
      
   long long N = (1<<logN);
   CircuitOramOpt oram(logN, cap, access, evict);
   long long i = 0;
   int warmup = 1<<20;
   map<long long, long long> counter;
   
   cout <<"Starting warmming up with "<<warmup<<" operations."<<endl;
   for(int i = 0; i < (N > warmup ? N : warmup); ++i)
      oram.access(i%N);
   i = 0;
   cout <<"Warmup completed."<<endl;
   while(true)
   {
      bool res = oram.access(i%N);
      if(not res)
      {
         cout<<"tree oram invariance is broken"<<i<<endl;
      }
      ++counter[oram.stash_size()];
      ++i;
      if((i%1000000) == 0)
         pruint64_t(i, counter, string("circuit_opt")+"_"+string(argv[1])+"_"+string(argv[2])+"_"+string(argv[3])+"_"+string(argv[4]));
   }
}